

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

bool rw::readChunkHeaderInfo(Stream *s,ChunkHeaderInfo *header)

{
  int iVar1;
  uint uVar2;
  uint32 uVar3;
  anon_struct_12_3_2a00130e buf;
  undefined8 local_20;
  uint local_18;
  
  (*s->_vptr_Stream[4])(s,&local_20,0xc);
  iVar1 = (*s->_vptr_Stream[7])(s);
  if ((byte)iVar1 == 0) {
    header->type = (undefined4)local_20;
    header->length = local_20._4_4_;
    if (local_18 < 0x10000) {
      uVar3 = local_18 << 8;
    }
    else {
      uVar3 = (local_18 >> 0xe & 0x3ff00) + (local_18 >> 0x10 & 0x3f) + 0x30000;
    }
    header->version = uVar3;
    uVar2 = local_18 & 0xffff;
    if (local_18 < 0x10000) {
      uVar2 = 0;
    }
    header->build = uVar2;
  }
  return (bool)((byte)iVar1 ^ 1);
}

Assistant:

bool
readChunkHeaderInfo(Stream *s, ChunkHeaderInfo *header)
{
	struct {
		int32 type, size;
		uint32 id;
	} buf;
	s->read32(&buf, 12);
	if(s->eof())
		return false;
	assert(header != nil);
	header->type = buf.type;
	header->length = buf.size;
	header->version = libraryIDUnpackVersion(buf.id);
	header->build = libraryIDUnpackBuild(buf.id);
	return true;
}